

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_assemble_fragment(AV1Context *ctx,Av1UnitFragment *frag)

{
  RK_U8 *pRVar1;
  RK_S32 RVar2;
  RK_U8 *pRVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  
  if ((long)frag->nb_units < 1) {
    sVar6 = 0;
  }
  else {
    lVar4 = 0;
    sVar6 = 0;
    do {
      sVar6 = sVar6 + *(long *)((long)&frag->units->data_size + lVar4);
      lVar4 = lVar4 + 0x20;
    } while ((long)frag->nb_units * 0x20 != lVar4);
  }
  pRVar3 = (RK_U8 *)mpp_osal_malloc("mpp_av1_assemble_fragment",sVar6 + 0x40);
  frag->data = pRVar3;
  if (pRVar3 == (RK_U8 *)0x0) {
    RVar2 = -0x3ee;
  }
  else {
    pRVar1 = pRVar3 + sVar6 + 0x30;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    pRVar1[2] = '\0';
    pRVar1[3] = '\0';
    pRVar1[4] = '\0';
    pRVar1[5] = '\0';
    pRVar1[6] = '\0';
    pRVar1[7] = '\0';
    pRVar1[8] = '\0';
    pRVar1[9] = '\0';
    pRVar1[10] = '\0';
    pRVar1[0xb] = '\0';
    pRVar1[0xc] = '\0';
    pRVar1[0xd] = '\0';
    pRVar1[0xe] = '\0';
    pRVar1[0xf] = '\0';
    pRVar1 = pRVar3 + sVar6 + 0x20;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    pRVar1[2] = '\0';
    pRVar1[3] = '\0';
    pRVar1[4] = '\0';
    pRVar1[5] = '\0';
    pRVar1[6] = '\0';
    pRVar1[7] = '\0';
    pRVar1[8] = '\0';
    pRVar1[9] = '\0';
    pRVar1[10] = '\0';
    pRVar1[0xb] = '\0';
    pRVar1[0xc] = '\0';
    pRVar1[0xd] = '\0';
    pRVar1[0xe] = '\0';
    pRVar1[0xf] = '\0';
    pRVar1 = pRVar3 + sVar6 + 0x10;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    pRVar1[2] = '\0';
    pRVar1[3] = '\0';
    pRVar1[4] = '\0';
    pRVar1[5] = '\0';
    pRVar1[6] = '\0';
    pRVar1[7] = '\0';
    pRVar1[8] = '\0';
    pRVar1[9] = '\0';
    pRVar1[10] = '\0';
    pRVar1[0xb] = '\0';
    pRVar1[0xc] = '\0';
    pRVar1[0xd] = '\0';
    pRVar1[0xe] = '\0';
    pRVar1[0xf] = '\0';
    pRVar3 = pRVar3 + sVar6;
    pRVar3[0] = '\0';
    pRVar3[1] = '\0';
    pRVar3[2] = '\0';
    pRVar3[3] = '\0';
    pRVar3[4] = '\0';
    pRVar3[5] = '\0';
    pRVar3[6] = '\0';
    pRVar3[7] = '\0';
    pRVar3[8] = '\0';
    pRVar3[9] = '\0';
    pRVar3[10] = '\0';
    pRVar3[0xb] = '\0';
    pRVar3[0xc] = '\0';
    pRVar3[0xd] = '\0';
    pRVar3[0xe] = '\0';
    pRVar3[0xf] = '\0';
    if (frag->nb_units < 1) {
      sVar7 = 0;
    }
    else {
      lVar4 = 0x10;
      lVar5 = 0;
      sVar7 = 0;
      do {
        memcpy(frag->data + sVar7,*(void **)((long)frag->units + lVar4 + -8),
               *(size_t *)((long)&frag->units->type + lVar4));
        sVar7 = sVar7 + *(long *)((long)&frag->units->type + lVar4);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar5 < frag->nb_units);
    }
    if ((sVar7 != sVar6) &&
       (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,"pos == size",
                   "mpp_av1_assemble_fragment",0xc13), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    frag->data_size = sVar6;
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

RK_S32 mpp_av1_assemble_fragment(AV1Context *ctx, Av1UnitFragment *frag)
{
    size_t size, pos;
    RK_S32 i;
    (void)ctx;
    size = 0;
    for (i = 0; i < frag->nb_units; i++)
        size += frag->units[i].data_size;

    frag->data = mpp_malloc(RK_U8, size + BUFFER_PADDING_SIZE);
    if (!frag->data)
        return MPP_ERR_NOMEM;

    memset(frag->data + size, 0, BUFFER_PADDING_SIZE);

    pos = 0;
    for (i = 0; i < frag->nb_units; i++) {
        memcpy(frag->data + pos, frag->units[i].data,
               frag->units[i].data_size);
        pos += frag->units[i].data_size;
    }
    mpp_assert(pos == size);
    frag->data_size = size;

    return 0;
}